

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.h
# Opt level: O0

void __thiscall
spvtools::opt::Instruction::ForEachInId(Instruction *this,function<void_(const_unsigned_int_*)> *f)

{
  anon_class_8_1_54a39806 local_40;
  function<bool_(const_unsigned_int_*)> local_38;
  function<void_(const_unsigned_int_*)> *local_18;
  function<void_(const_unsigned_int_*)> *f_local;
  Instruction *this_local;
  
  local_40.f = f;
  local_18 = f;
  f_local = (function<void_(const_unsigned_int_*)> *)this;
  std::function<bool(unsigned_int_const*)>::
  function<spvtools::opt::Instruction::ForEachInId(std::function<void(unsigned_int_const*)>const&)const::_lambda(unsigned_int_const*)_1_,void>
            ((function<bool(unsigned_int_const*)> *)&local_38,&local_40);
  WhileEachInId(this,&local_38);
  std::function<bool_(const_unsigned_int_*)>::~function(&local_38);
  return;
}

Assistant:

inline void Instruction::ForEachInId(
    const std::function<void(const uint32_t*)>& f) const {
  WhileEachInId([&f](const uint32_t* id) {
    f(id);
    return true;
  });
}